

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_void_void_ptr *xDel;
  char *pcVar5;
  Mem *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  int nOut_1;
  u8 enc;
  int nOut;
  char *zStart;
  Mem *pVar;
  int i;
  int n;
  int nextIndex;
  sqlite3 *db;
  Mem utf8;
  StrAccum out;
  int nToken;
  int idx;
  Mem *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  Vdbe *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  char cVar7;
  int iVar8;
  Mem *pMVar9;
  char *pcVar10;
  undefined1 local_68 [24];
  char *local_50;
  sqlite3 *local_30;
  char *local_28;
  u8 uVar12;
  undefined1 *puVar11;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 1;
  iVar8 = -0x55555556;
  local_30 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puVar11 = &DAT_aaaaaaaaaaaaaaaa;
  memcpy(local_68,&DAT_002ab5a8,0x38);
  pcVar5 = (char *)*in_RDI;
  sqlite3StrAccumInit((StrAccum *)&local_30,(sqlite3 *)0x0,(char *)0x0,0,*(int *)(pcVar5 + 0x88));
  uVar12 = (u8)((ulong)puVar11 >> 0x20);
  if (*(int *)(pcVar5 + 0xdc) < 2) {
    if ((short)in_RDI[4] == 0) {
      sqlite3Strlen30((char *)in_stack_ffffffffffffff38);
      sqlite3_str_append((sqlite3_str *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (char *)in_stack_ffffffffffffff38,0);
    }
    else {
      while (uVar12 = (u8)((ulong)puVar11 >> 0x20), *(char *)&in_RSI->u != '\0') {
        iVar2 = findNextHostParameter
                          ((char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (int *)in_stack_ffffffffffffff48);
        sqlite3_str_append((sqlite3_str *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (char *)in_stack_ffffffffffffff38,0);
        pcVar10 = (char *)((long)&in_RSI->u + (long)iVar2);
        iVar4 = local_c;
        if (*pcVar10 != '?') {
          iVar3 = sqlite3VdbeParameterIndex
                            (in_stack_ffffffffffffff48,
                             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          iVar4 = local_c;
          local_c = iVar3;
        }
        in_stack_ffffffffffffff44 = iVar4;
        in_RSI = (Mem *)(pcVar10 + -0x55555556);
        if (in_stack_ffffffffffffff44 < local_c + 1) {
          in_stack_ffffffffffffff44 = local_c + 1;
        }
        xDel = (_func_void_void_ptr *)(in_RDI[0x10] + (long)(local_c + -1) * 0x38);
        local_c = in_stack_ffffffffffffff44;
        if ((*(ushort *)(xDel + 0x14) & 1) == 0) {
          if ((*(ushort *)(xDel + 0x14) & 0x24) == 0) {
            if ((*(ushort *)(xDel + 0x14) & 8) == 0) {
              if ((*(ushort *)(xDel + 0x14) & 2) == 0) {
                if ((*(ushort *)(xDel + 0x14) & 0x400) == 0) {
                  sqlite3_str_append((sqlite3_str *)
                                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                     (char *)in_stack_ffffffffffffff38,0);
                  in_stack_ffffffffffffff54 = *(uint *)(xDel + 0x10);
                  for (iVar8 = 0; iVar8 < (int)in_stack_ffffffffffffff54; iVar8 = iVar8 + 1) {
                    sqlite3_str_appendf((StrAccum *)&local_30,"%02x",
                                        (ulong)*(byte *)(*(long *)(xDel + 8) + (long)iVar8));
                  }
                  sqlite3_str_append((sqlite3_str *)
                                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                     (char *)in_stack_ffffffffffffff38,0);
                }
                else {
                  sqlite3_str_appendf((StrAccum *)&local_30,"zeroblob(%d)",(ulong)*(uint *)xDel);
                }
              }
              else {
                cVar7 = pcVar5[100];
                if (cVar7 != '\x01') {
                  memset(local_68,0,0x38);
                  local_50 = pcVar5;
                  sqlite3VdbeMemSetStr
                            (in_RSI,pcVar5,CONCAT44(local_c,iVar2),(u8)((uint)iVar8 >> 0x18),xDel);
                  iVar4 = sqlite3VdbeChangeEncoding(in_stack_ffffffffffffff38,0);
                  if (iVar4 == 7) {
                    puVar11 = (undefined1 *)0x700000000;
                  }
                  xDel = (_func_void_void_ptr *)local_68;
                }
                sqlite3_str_appendf((StrAccum *)&local_30,"\'%.*q\'",(ulong)*(uint *)(xDel + 0x10),
                                    *(undefined8 *)(xDel + 8));
                if (cVar7 != '\x01') {
                  sqlite3VdbeMemRelease((Mem *)0x142411);
                }
              }
            }
            else {
              sqlite3_str_appendf(*(StrAccum **)xDel,(char *)&local_30,"%!.15g");
            }
          }
          else {
            sqlite3_str_appendf((StrAccum *)&local_30,"%lld",*(undefined8 *)xDel);
          }
        }
        else {
          sqlite3_str_append((sqlite3_str *)
                             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                             (char *)in_stack_ffffffffffffff38,0);
        }
      }
    }
  }
  else {
    while (uVar12 = (u8)((ulong)puVar11 >> 0x20), pMVar9 = in_RSI, *(char *)&in_RSI->u != '\0') {
      do {
        in_RSI = (Mem *)((long)&pMVar9->u + 1);
        bVar6 = false;
        if (*(char *)&pMVar9->u != '\n') {
          bVar6 = *(char *)&in_RSI->u != '\0';
        }
        pMVar9 = in_RSI;
      } while (bVar6);
      sqlite3_str_append((sqlite3_str *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (char *)in_stack_ffffffffffffff38,0);
      sqlite3_str_append((sqlite3_str *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (char *)in_stack_ffffffffffffff38,0);
    }
  }
  if (uVar12 != '\0') {
    sqlite3_str_reset((StrAccum *)0x142506);
  }
  pcVar5 = sqlite3StrAccumFinish((StrAccum *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pcVar5;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 into UTF8 for display */
#endif

  db = p->db;
  sqlite3StrAccumInit(&out, 0, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3_str_append(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3_str_append(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3_str_append(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3_str_append(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = MAX(idx + 1, nextIndex);
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3_str_append(&out, "NULL", 4);
      }else if( pVar->flags & (MEM_Int|MEM_IntReal) ){
        sqlite3_str_appendf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3_str_appendf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = SQLITE_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif
        sqlite3_str_appendf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3_str_appendf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3_str_append(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3_str_appendf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3_str_append(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3_str_appendf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3_str_reset(&out);
  return sqlite3StrAccumFinish(&out);
}